

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

PyObject * __thiscall
boost::python::detail::caller_arity<1U>::
impl<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>,_boost::mpl::vector2<std::vector<int,_std::allocator<int>_>_&,_HFParsingInfo_&>_>
::operator()(impl<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>,_boost::mpl::vector2<std::vector<int,_std::allocator<int>_>_&,_HFParsingInfo_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  PyObject *pPVar1;
  argument_package inner_args;
  c_t0 c0;
  PyObject *local_20;
  arg_lvalue_from_python_base local_18;
  
  local_20 = args_;
  converter::reference_arg_from_python<HFParsingInfo_&>::reference_arg_from_python
            ((reference_arg_from_python<HFParsingInfo_&> *)&local_18,(PyObject *)args_[1].ob_type);
  if (local_18.m_result == (void *)0x0) {
    pPVar1 = (PyObject *)0x0;
  }
  else {
    pPVar1 = make_reference_holder::execute<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)
                        ((long)local_18.m_result +
                        (this->m_data).
                        super_compressed_pair_imp<boost::python::detail::member<std::vector<int,_std::allocator<int>_>,_HFParsingInfo>,_boost::python::return_internal_reference<1UL,_boost::python::default_call_policies>,_2>
                        .first_.m_which));
    pPVar1 = with_custodian_and_ward_postcall<0ul,1ul,boost::python::default_call_policies>::
             postcall<_object*>(&local_20,pPVar1);
  }
  return pPVar1;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }